

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpruneL.c
# Opt level: O2

void dpruneL(int jcol,int *perm_r,int pivrow,int nseg,int *segrep,int *repfnz,int_t *xprune,
            GlobalLU_t *Glu)

{
  int *piVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  int *piVar9;
  int_t *piVar10;
  int_t *piVar11;
  void *pvVar12;
  int_t *piVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  
  piVar8 = Glu->xsup;
  piVar9 = Glu->supno;
  piVar10 = Glu->lsub;
  piVar11 = Glu->xlsub;
  pvVar12 = Glu->lusup;
  piVar13 = Glu->xlusup;
  iVar3 = piVar9[jcol];
  uVar20 = 0;
  uVar16 = (ulong)(uint)nseg;
  if (nseg < 1) {
    uVar16 = uVar20;
  }
  do {
    if (uVar20 == uVar16) {
      return;
    }
    iVar4 = segrep[uVar20];
    if ((((repfnz[iVar4] != -1) && (iVar5 = piVar9[iVar4], iVar5 != piVar9[(long)iVar4 + 1])) &&
        (iVar5 != iVar3)) && (iVar6 = piVar11[(long)iVar4 + 1], iVar6 <= xprune[iVar4])) {
      uVar19 = (ulong)(uint)piVar11[iVar4];
      lVar15 = (long)piVar11[iVar4];
      while (lVar15 < iVar6) {
        piVar1 = piVar10 + lVar15;
        lVar15 = lVar15 + 1;
        if (*piVar1 == pivrow) {
          iVar5 = piVar8[iVar5];
LAB_00108e5e:
          do {
            iVar14 = iVar6;
            iVar6 = iVar14 + -1;
            uVar19 = (ulong)(int)uVar19;
            while( true ) {
              iVar18 = (int)uVar19;
              if (iVar14 <= iVar18) {
                xprune[iVar4] = iVar18;
                goto LAB_00108ee6;
              }
              if (perm_r[piVar10[iVar6]] == -1) goto LAB_00108e5e;
              iVar7 = piVar10[uVar19];
              if (perm_r[iVar7] == -1) break;
              uVar19 = uVar19 + 1;
            }
            piVar10[uVar19] = piVar10[iVar6];
            piVar10[iVar6] = iVar7;
            if (iVar4 == iVar5) {
              lVar17 = (long)((piVar13[iVar4] - piVar11[iVar4]) + iVar18);
              uVar2 = *(undefined8 *)((long)pvVar12 + lVar17 * 8);
              lVar15 = (long)((piVar13[iVar4] + iVar6) - piVar11[iVar4]);
              *(undefined8 *)((long)pvVar12 + lVar17 * 8) =
                   *(undefined8 *)((long)pvVar12 + lVar15 * 8);
              *(undefined8 *)((long)pvVar12 + lVar15 * 8) = uVar2;
            }
            uVar19 = (ulong)(iVar18 + 1);
          } while( true );
        }
      }
    }
LAB_00108ee6:
    uVar20 = uVar20 + 1;
  } while( true );
}

Assistant:

void
dpruneL(
       const int  jcol,	     /* in */
       const int  *perm_r,   /* in */
       const int  pivrow,    /* in */
       const int  nseg,	     /* in */
       const int  *segrep,   /* in */
       const int  *repfnz,   /* in */
       int_t      *xprune,   /* out */
       GlobalLU_t *Glu       /* modified - global LU data structures */
       )
{

    double     utemp;
    int        jsupno, irep, irep1, kmin, kmax, krow, movnum;
    int_t      i, ktemp, minloc, maxloc;
    int        do_prune; /* logical variable */
    int        *xsup, *supno;
    int_t      *lsub, *xlsub;
    double     *lusup;
    int_t      *xlusup;

    xsup       = Glu->xsup;
    supno      = Glu->supno;
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;
    lusup      = (double *) Glu->lusup;
    xlusup     = Glu->xlusup;
    
    /*
     * For each supernode-rep irep in U[*,j]
     */
    jsupno = supno[jcol];
    for (i = 0; i < nseg; i++) {

	irep = segrep[i];
	irep1 = irep + 1;
	do_prune = FALSE;

	/* Don't prune with a zero U-segment */
 	if ( repfnz[irep] == SLU_EMPTY )
		continue;

     	/* If a snode overlaps with the next panel, then the U-segment 
   	 * is fragmented into two parts -- irep and irep1. We should let
	 * pruning occur at the rep-column in irep1's snode. 
	 */
	if ( supno[irep] == supno[irep1] ) 	/* Don't prune */
		continue;

	/*
	 * If it has not been pruned & it has a nonz in row L[pivrow,i]
	 */
	if ( supno[irep] != jsupno ) {
	    if ( xprune[irep] >= xlsub[irep1] ) {
		kmin = xlsub[irep];
		kmax = xlsub[irep1] - 1;
		for (krow = kmin; krow <= kmax; krow++) 
		    if ( lsub[krow] == pivrow ) {
			do_prune = TRUE;
			break;
		    }
	    }
	    
    	    if ( do_prune ) {

	     	/* Do a quicksort-type partition
	     	 * movnum=TRUE means that the num values have to be exchanged.
	     	 */
	        movnum = FALSE;
	        if ( irep == xsup[supno[irep]] ) /* Snode of size 1 */
			movnum = TRUE;

	        while ( kmin <= kmax ) {

	    	    if ( perm_r[lsub[kmax]] == SLU_EMPTY ) 
			kmax--;
		    else if ( perm_r[lsub[kmin]] != SLU_EMPTY )
			kmin++;
		    else { /* kmin below pivrow (not yet pivoted), and kmax
                            * above pivrow: interchange the two subscripts
			    */
		        ktemp = lsub[kmin];
		        lsub[kmin] = lsub[kmax];
		        lsub[kmax] = ktemp;

			/* If the supernode has only one column, then we
 			 * only keep one set of subscripts. For any subscript 
			 * interchange performed, similar interchange must be 
			 * done on the numerical values.
 			 */
		        if ( movnum ) {
		    	    minloc = xlusup[irep] + (kmin - xlsub[irep]);
		    	    maxloc = xlusup[irep] + (kmax - xlsub[irep]);
			    utemp = lusup[minloc];
		  	    lusup[minloc] = lusup[maxloc];
			    lusup[maxloc] = utemp;
		        }

		        kmin++;
		        kmax--;

		    }

	        } /* while */

	        xprune[irep] = kmin;	/* Pruning */

#ifdef CHK_PRUNE
	printf("    After dpruneL(),using col %d:  xprune[%d] = %d\n", 
			jcol, irep, kmin);
#endif
	    } /* if do_prune */

	} /* if */

    } /* for each U-segment... */
}